

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O1

Builder * arangodb::velocypack::Collection::concat
                    (Builder *__return_storage_ptr__,Slice slice1,Slice slice2)

{
  Builder::Builder(__return_storage_ptr__);
  Builder::openCompoundValue(__return_storage_ptr__,'\x06');
  appendArray(__return_storage_ptr__,slice1);
  appendArray(__return_storage_ptr__,slice2);
  Builder::close(__return_storage_ptr__,(int)slice2._start);
  return __return_storage_ptr__;
}

Assistant:

Builder Collection::concat(Slice slice1, Slice slice2) {
  Builder b;
  b.openArray();
  appendArray(b, slice1);
  appendArray(b, slice2);
  b.close();

  return b;
}